

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void m68k_tr_init_disas_context(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  TranslationBlock_conflict *pTVar1;
  
  pTVar1 = (TranslationBlock_conflict *)cpu->env_ptr;
  *(uc_struct_conflict7 **)&dcbase[6].is_jmp = cpu->uc;
  dcbase[1].tb = pTVar1;
  dcbase[1].pc_first = dcbase->pc_first;
  dcbase[1].pc_next = 0;
  dcbase[1].is_jmp = DISAS_TOO_MANY;
  dcbase[2].tb = (TranslationBlock_conflict *)0x0;
  dcbase[4].pc_first = 0;
  return;
}

Assistant:

static void m68k_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUM68KState *env = cpu->env_ptr;

    // unicorn setup
    dc->uc = cpu->uc;

    dc->env = env;
    dc->pc = dc->base.pc_first;
    dc->cc_op = CC_OP_DYNAMIC;
    dc->cc_op_synced = 1;
    dc->done_mac = 0;
    dc->writeback_mask = 0;
    init_release_array(dc);
}